

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int AllocateInternalBuffers32b(VP8LDecoder *dec,int final_width)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  long lVar3;
  
  lVar3 = (long)dec->height_ * (long)dec->width_;
  puVar1 = (uint32_t *)
           WebPSafeMalloc((long)final_width * 0x10 + (ulong)(ushort)final_width + lVar3,4);
  dec->pixels_ = puVar1;
  if (puVar1 == (uint32_t *)0x0) {
    dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
    puVar2 = (uint32_t *)0x0;
  }
  else {
    puVar2 = puVar1 + lVar3 + (ulong)(ushort)final_width;
  }
  dec->argb_cache_ = puVar2;
  return (uint)(puVar1 != (uint32_t *)0x0);
}

Assistant:

static int AllocateInternalBuffers32b(VP8LDecoder* const dec, int final_width) {
  const uint64_t num_pixels = (uint64_t)dec->width_ * dec->height_;
  // Scratch buffer corresponding to top-prediction row for transforming the
  // first row in the row-blocks. Not needed for paletted alpha.
  const uint64_t cache_top_pixels = (uint16_t)final_width;
  // Scratch buffer for temporary BGRA storage. Not needed for paletted alpha.
  const uint64_t cache_pixels = (uint64_t)final_width * NUM_ARGB_CACHE_ROWS;
  const uint64_t total_num_pixels =
      num_pixels + cache_top_pixels + cache_pixels;

  assert(dec->width_ <= final_width);
  dec->pixels_ = (uint32_t*)WebPSafeMalloc(total_num_pixels, sizeof(uint32_t));
  if (dec->pixels_ == NULL) {
    dec->argb_cache_ = NULL;    // for soundness
    dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
    return 0;
  }
  dec->argb_cache_ = dec->pixels_ + num_pixels + cache_top_pixels;
  return 1;
}